

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O2

void __thiscall
FibHeap<std::pair<double,_int>_>::decKey
          (FibHeap<std::pair<double,_int>_> *this,Node *x,pair<double,_int> *key)

{
  Node *y;
  bool bVar1;
  
  (x->key).first = key->first;
  (x->key).second = key->second;
  y = x->p;
  if (y != (Node *)0x0) {
    bVar1 = std::operator<(&x->key,&y->key);
    if (bVar1) {
      cut(this,x);
      cascadingCut(this,y);
    }
  }
  bVar1 = std::operator<(&x->key,&this->min->key);
  if (bVar1) {
    this->min = x;
  }
  return;
}

Assistant:

void decKey(Node *x, const K &key)
	{
		x->key = key;
		Node *y = x->p;
		if (y && x->key < y->key)
			cut(x), cascadingCut(y);
		if (x->key < min->key)
			min = x;
	}